

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O2

shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
 __thiscall mbc::Val::VecStr::json_value(VecStr *this)

{
  _func_int **pp_Var1;
  VecStr *pVVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar4;
  long in_RSI;
  shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  sVar5;
  StringRefType local_68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_58;
  StringRefType local_48;
  VecStr *local_38;
  
  std::
  make_shared<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            ();
  allocator = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)ValBase::doc_);
  pp_Var1 = (this->super__ValAtom).super_ValBase._vptr_ValBase;
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  *(undefined2 *)((long)pp_Var1 + 0xe) = 3;
  local_68.s = "valid";
  local_68.length = 5;
  local_38 = this;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)(this->super__ValAtom).super_ValBase._vptr_ValBase,&local_68,
                  *(bool *)*(undefined8 *)(in_RSI + 0x18),allocator);
  value = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)operator_new(0x10);
  (value->data_).n = (Number)0x0;
  (value->data_).s.str = (Ch *)0x0;
  (value->data_).f.flags = 4;
  puVar3 = *(undefined8 **)(in_RSI + 0x30);
  for (puVar4 = (undefined8 *)*puVar3; pVVar2 = local_38, puVar4 != (undefined8 *)puVar3[1];
      puVar4 = puVar4 + 4) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(&local_58,(Ch *)*puVar4,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(value,&local_58,allocator);
    puVar3 = *(undefined8 **)(in_RSI + 0x30);
  }
  local_48.s = "value";
  local_48.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(local_38->super__ValAtom).super_ValBase._vptr_ValBase,&local_48,value,allocator);
  operator_delete(value);
  sVar5.
  super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.
  super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pVVar2;
  return (shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          )sVar5.
           super___shared_ptr<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<Value> VecStr::json_value() {
    shared_ptr<Value> v = std::make_shared<Value>();
    auto& allo = doc_.GetAllocator();

    v -> SetObject();
    v -> AddMember("valid", *is_vaild_, allo);

    auto vv = new Value();
    vv -> SetArray();
    for (auto it = value_->begin(); it != value_->end(); ++it) {
        vv -> PushBack(Value(it->c_str(), allo).Move(), allo);
    }
    v -> AddMember("value", *vv, allo);
    delete vv;

    return v;
}